

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O2

void __thiscall
QGraphicsSceneBspTreeIndex::~QGraphicsSceneBspTreeIndex(QGraphicsSceneBspTreeIndex *this)

{
  long lVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  *(undefined ***)this = &PTR_metaObject_007ed980;
  lVar1 = *(long *)(this + 8);
  uVar2 = *(ulong *)(lVar1 + 0x118);
  for (uVar4 = 0; uVar4 < uVar2; uVar4 = uVar4 + 1) {
    lVar3 = *(long *)(*(long *)(lVar1 + 0x110) + uVar4 * 8);
    if (lVar3 != 0) {
      *(undefined4 *)(*(long *)(lVar3 + 8) + 0x110) = 0xffffffff;
    }
  }
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QGraphicsSceneBspTreeIndex::~QGraphicsSceneBspTreeIndex()
{
    Q_D(QGraphicsSceneBspTreeIndex);
    for (int i = 0; i < d->indexedItems.size(); ++i) {
        // Ensure item bits are reset properly.
        if (QGraphicsItem *item = d->indexedItems.at(i)) {
            Q_ASSERT(!item->d_ptr->itemDiscovered);
            item->d_ptr->index = -1;
        }
    }
}